

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O1

Vec_Int_t * Gia_ManLutCollect2(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int Entry;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  iVar3 = Gia_ManLutNum(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar6 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar4;
  Gia_ManIncrementTravId(p);
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      iVar6 = pVVar5->pArray[lVar12];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_0073b6f2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      pGVar1 = pGVar2 + iVar6;
      uVar10 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      if ((~*(uint *)(pGVar1 + -uVar10) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar1 + -uVar10))
      {
        pGVar1 = pGVar1 + -uVar10;
        if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar9 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
        if (((int)uVar9 < 0) || (p->vMapping->nSize <= (int)uVar9)) goto LAB_0073b6d3;
        if (p->vMapping->pArray[uVar9 & 0x7fffffff] == 0) {
          __assert_fail("Gia_ObjIsLut(p, Id)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaPack.c"
                        ,0x39,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
        }
        if (p->nTravIdsAlloc <= (int)uVar9) {
LAB_0073b711:
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        if (p->pTravIds[uVar9 & 0x7fffffff] != p->nTravIds) {
          p->pTravIds[uVar9 & 0x7fffffff] = p->nTravIds;
          Vec_IntPush(p_00,uVar9);
        }
      }
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCos;
    } while (lVar12 < pVVar5->nSize);
  }
  uVar9 = p_00->nSize;
  if (0 < (int)uVar9) {
    lVar12 = 0;
    do {
      iVar6 = p_00->pArray[lVar12];
      if ((long)iVar6 < 0) {
LAB_0073b6d3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar11 = 0;
      while( true ) {
        iVar3 = p->vMapping->nSize;
        if (iVar3 <= iVar6) goto LAB_0073b6d3;
        piVar4 = p->vMapping->pArray;
        lVar8 = (long)piVar4[iVar6];
        if ((lVar8 < 0) || (iVar3 <= piVar4[iVar6])) goto LAB_0073b6d3;
        if (piVar4[lVar8] <= lVar11) break;
        Entry = piVar4[lVar8 + lVar11 + 1];
        lVar8 = (long)Entry;
        if ((lVar8 < 0) || (p->nObjs <= Entry)) goto LAB_0073b6f2;
        if ((~*(uint *)(p->pObjs + lVar8) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(p->pObjs + lVar8)) {
          if (iVar3 <= Entry) goto LAB_0073b6d3;
          if (piVar4[lVar8] == 0) {
            __assert_fail("Gia_ObjIsLut(p, iFan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaPack.c"
                          ,0x45,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
          }
          if (p->nTravIdsAlloc <= Entry) goto LAB_0073b711;
          if (p->pTravIds[lVar8] != p->nTravIds) {
            p->pTravIds[lVar8] = p->nTravIds;
            Vec_IntPush(p_00,Entry);
          }
        }
        lVar11 = lVar11 + 1;
        if (iVar6 < 0) goto LAB_0073b6d3;
      }
      lVar12 = lVar12 + 1;
      uVar9 = p_00->nSize;
    } while (lVar12 < (int)uVar9);
  }
  if (uVar9 != p_00->nCap && p_00->nCap != 0x10) {
    __assert_fail("Vec_IntCap(vOrder) == 16 || Vec_IntSize(vOrder) == Vec_IntCap(vOrder)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaPack.c"
                  ,0x4c,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
  }
  if (1 < (int)uVar9) {
    piVar4 = p_00->pArray;
    uVar7 = uVar9 >> 1;
    uVar10 = 0;
    do {
      uVar9 = uVar9 - 1;
      iVar6 = piVar4[uVar10];
      piVar4[uVar10] = piVar4[(int)uVar9];
      piVar4[(int)uVar9] = iVar6;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects LUT nodes in the increasing order of distance from COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManLutCollect2( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOrder;
    int i, k, Id, iFan;
    vOrder = Vec_IntAlloc( Gia_ManLutNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        Id = Gia_ObjId( p, pObj );
        assert( Gia_ObjIsLut(p, Id) );
        if ( Gia_ObjIsTravIdCurrentId(p, Id) )
            continue;
        Gia_ObjSetTravIdCurrentId(p, Id);
        Vec_IntPush( vOrder, Id );
    }
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            if ( !Gia_ObjIsAnd(Gia_ManObj(p, iFan)) )
                continue;
            assert( Gia_ObjIsLut(p, iFan) );
            if ( Gia_ObjIsTravIdCurrentId(p, iFan) )
                continue;
            Gia_ObjSetTravIdCurrentId(p, iFan);
            Vec_IntPush( vOrder, iFan );
        }
    }
    assert( Vec_IntCap(vOrder) == 16 || Vec_IntSize(vOrder) == Vec_IntCap(vOrder) );
    Vec_IntReverseOrder( vOrder );
    return vOrder;
}